

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O3

TypeVector * __thiscall wabt::Type::GetInlineVector(TypeVector *__return_storage_ptr__,Type *this)

{
  uint uVar1;
  pointer pTVar2;
  
  if (I32 < this->enum_) {
    __assert_fail("!IsIndex()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/type.h",
                  0x72,"TypeVector wabt::Type::GetInlineVector() const");
  }
  uVar1 = this->enum_ + 0x40;
  if (uVar1 < 0x40) {
    if ((0xf801c10000000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      if ((ulong)uVar1 != 0) goto LAB_0014bff9;
      (__return_storage_ptr__->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      pTVar2 = (pointer)operator_new(4);
      (__return_storage_ptr__->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_start = pTVar2;
      (__return_storage_ptr__->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = pTVar2 + 1;
      pTVar2->enum_ = this->enum_;
      (__return_storage_ptr__->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish = pTVar2 + 1;
    }
    return __return_storage_ptr__;
  }
LAB_0014bff9:
  abort();
}

Assistant:

bool IsIndex() const { return static_cast<int32_t>(enum_) >= 0; }